

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDual.c
# Opt level: O0

Aig_Man_t *
Saig_ManDupDual(Aig_Man_t *pAig,Vec_Int_t *vDcFlops,int nDualPis,int fDualFfs,int fMiterFfs,
               int fComplPo,int fCheckZero,int fCheckOne)

{
  Vec_Ptr_t *pVVar1;
  Aig_Obj_t *pAVar2;
  Aig_Man_t *pAVar3;
  Vec_Int_t *p;
  int iVar4;
  int iVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  int local_74;
  Aig_Obj_t *pAStack_70;
  int i;
  Aig_Obj_t *pMiter;
  Aig_Obj_t *pCare;
  Aig_Obj_t *pTemp3;
  Aig_Obj_t *pTemp2;
  Aig_Obj_t *pTemp1;
  Aig_Obj_t *pTemp0;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAigNew;
  Vec_Ptr_t *vCopies;
  int fComplPo_local;
  int fMiterFfs_local;
  int fDualFfs_local;
  int nDualPis_local;
  Vec_Int_t *vDcFlops_local;
  Aig_Man_t *pAig_local;
  
  vCopies._0_4_ = fComplPo;
  vCopies._4_4_ = fMiterFfs;
  fComplPo_local = fDualFfs;
  fMiterFfs_local = nDualPis;
  _fDualFfs_local = vDcFlops;
  vDcFlops_local = (Vec_Int_t *)pAig;
  iVar4 = Saig_ManPoNum(pAig);
  iVar5 = fMiterFfs_local;
  if (iVar4 < 1) {
    __assert_fail("Saig_ManPoNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigDual.c"
                  ,0x57,
                  "Aig_Man_t *Saig_ManDupDual(Aig_Man_t *, Vec_Int_t *, int, int, int, int, int, int)"
                 );
  }
  if ((-1 < fMiterFfs_local) && (iVar4 = Saig_ManPiNum((Aig_Man_t *)vDcFlops_local), iVar5 <= iVar4)
     ) {
    if (_fDualFfs_local != (Vec_Int_t *)0x0) {
      iVar5 = Vec_IntSize(_fDualFfs_local);
      iVar4 = Aig_ManRegNum((Aig_Man_t *)vDcFlops_local);
      if (iVar5 != iVar4) {
        __assert_fail("vDcFlops == NULL || Vec_IntSize(vDcFlops) == Aig_ManRegNum(pAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigDual.c"
                      ,0x59,
                      "Aig_Man_t *Saig_ManDupDual(Aig_Man_t *, Vec_Int_t *, int, int, int, int, int, int)"
                     );
      }
    }
    iVar5 = Aig_ManObjNum((Aig_Man_t *)vDcFlops_local);
    pAigNew = (Aig_Man_t *)Vec_PtrStart(iVar5 << 1);
    iVar5 = Aig_ManNodeNum((Aig_Man_t *)vDcFlops_local);
    pObj = (Aig_Obj_t *)Aig_ManStart(iVar5);
    pAVar6 = (Aig_Obj_t *)Abc_UtilStrsav(*(char **)vDcFlops_local);
    pAVar3 = pAigNew;
    (pObj->field_0).pNext = pAVar6;
    pAVar6 = Aig_ManConst0((Aig_Man_t *)pObj);
    Saig_ObjSetDual((Vec_Ptr_t *)pAVar3,0,0,pAVar6);
    pAVar3 = pAigNew;
    pAVar6 = Aig_ManConst1((Aig_Man_t *)pObj);
    Saig_ObjSetDual((Vec_Ptr_t *)pAVar3,0,1,pAVar6);
    for (local_74 = 0; iVar5 = Vec_PtrSize(*(Vec_Ptr_t **)(vDcFlops_local + 1)), local_74 < iVar5;
        local_74 = local_74 + 1) {
      pTemp0 = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(vDcFlops_local + 1),local_74);
      if (local_74 < fMiterFfs_local) {
        pTemp1 = Aig_ObjCreateCi((Aig_Man_t *)pObj);
        pTemp2 = Aig_ObjCreateCi((Aig_Man_t *)pObj);
      }
      else {
        iVar5 = Saig_ManPiNum((Aig_Man_t *)vDcFlops_local);
        if (local_74 < iVar5) {
          pTemp2 = Aig_ObjCreateCi((Aig_Man_t *)pObj);
          pTemp1 = Aig_Not(pTemp2);
        }
        else {
          pTemp1 = Aig_ObjCreateCi((Aig_Man_t *)pObj);
          pTemp2 = Aig_ObjCreateCi((Aig_Man_t *)pObj);
          p = _fDualFfs_local;
          pAVar6 = pTemp1;
          if (_fDualFfs_local == (Vec_Int_t *)0x0) {
            pTemp1 = Aig_NotCond(pTemp1,(uint)((fComplPo_local != 0 ^ 0xffU) & 1));
          }
          else {
            iVar5 = Saig_ManPiNum((Aig_Man_t *)vDcFlops_local);
            iVar5 = Vec_IntEntry(p,local_74 - iVar5);
            pTemp1 = Aig_NotCond(pAVar6,(uint)((iVar5 != 0 ^ 0xffU) & 1));
          }
        }
      }
      pAVar3 = pAigNew;
      iVar5 = Aig_ObjId(pTemp0);
      pAVar2 = pObj;
      pAVar6 = pTemp1;
      pAVar7 = Aig_Not(pTemp2);
      pAVar6 = Aig_And((Aig_Man_t *)pAVar2,pAVar6,pAVar7);
      Saig_ObjSetDual((Vec_Ptr_t *)pAVar3,iVar5,0,pAVar6);
      pAVar3 = pAigNew;
      iVar5 = Aig_ObjId(pTemp0);
      pAVar2 = pObj;
      pAVar6 = pTemp2;
      pAVar7 = Aig_Not(pTemp1);
      pAVar6 = Aig_And((Aig_Man_t *)pAVar2,pAVar6,pAVar7);
      Saig_ObjSetDual((Vec_Ptr_t *)pAVar3,iVar5,1,pAVar6);
    }
    for (local_74 = 0; iVar5 = Vec_PtrSize(*(Vec_Ptr_t **)(vDcFlops_local + 2)), local_74 < iVar5;
        local_74 = local_74 + 1) {
      pTemp0 = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(vDcFlops_local + 2),local_74);
      if ((pTemp0 != (Aig_Obj_t *)0x0) && (iVar5 = Aig_ObjIsNode(pTemp0), iVar5 != 0)) {
        Saig_ObjDualFanin((Aig_Man_t *)pObj,(Vec_Ptr_t *)pAigNew,pTemp0,0,&pTemp1,&pTemp2);
        Saig_ObjDualFanin((Aig_Man_t *)pObj,(Vec_Ptr_t *)pAigNew,pTemp0,1,&pTemp3,&pCare);
        pAVar3 = pAigNew;
        iVar5 = Aig_ObjId(pTemp0);
        pAVar6 = Aig_Or((Aig_Man_t *)pObj,pTemp1,pTemp3);
        Saig_ObjSetDual((Vec_Ptr_t *)pAVar3,iVar5,0,pAVar6);
        pAVar3 = pAigNew;
        iVar5 = Aig_ObjId(pTemp0);
        pAVar6 = Aig_And((Aig_Man_t *)pObj,pTemp2,pCare);
        Saig_ObjSetDual((Vec_Ptr_t *)pAVar3,iVar5,1,pAVar6);
      }
    }
    pAStack_70 = Aig_ManConst0((Aig_Man_t *)pObj);
    if (vCopies._4_4_ == 0) {
      for (local_74 = 0; iVar5 = Saig_ManPoNum((Aig_Man_t *)vDcFlops_local), local_74 < iVar5;
          local_74 = local_74 + 1) {
        pTemp0 = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vDcFlops_local[1].pArray,local_74);
        Saig_ObjDualFanin((Aig_Man_t *)pObj,(Vec_Ptr_t *)pAigNew,pTemp0,0,&pTemp1,&pTemp2);
        pAVar2 = pObj;
        pAVar6 = pTemp1;
        if (fCheckZero == 0) {
          if (fCheckOne == 0) {
            pAVar6 = Aig_Not(pTemp1);
            pAVar7 = Aig_Not(pTemp2);
            pAVar6 = Aig_And((Aig_Man_t *)pAVar2,pAVar6,pAVar7);
            pAStack_70 = Aig_Or((Aig_Man_t *)pObj,pAStack_70,pAVar6);
          }
          else {
            pAVar6 = Aig_Not(pTemp1);
            pAVar6 = Aig_And((Aig_Man_t *)pAVar2,pAVar6,pTemp2);
            pAStack_70 = Aig_Or((Aig_Man_t *)pObj,pAStack_70,pAVar6);
          }
        }
        else {
          pAVar7 = Aig_Not(pTemp2);
          pAVar6 = Aig_And((Aig_Man_t *)pAVar2,pAVar6,pAVar7);
          pAStack_70 = Aig_Or((Aig_Man_t *)pObj,pAStack_70,pAVar6);
        }
      }
    }
    else {
      for (local_74 = 0; iVar5 = Saig_ManRegNum((Aig_Man_t *)vDcFlops_local), local_74 < iVar5;
          local_74 = local_74 + 1) {
        pVVar1 = (Vec_Ptr_t *)vDcFlops_local[1].pArray;
        iVar5 = Saig_ManPoNum((Aig_Man_t *)vDcFlops_local);
        pTemp0 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,local_74 + iVar5);
        Saig_ObjDualFanin((Aig_Man_t *)pObj,(Vec_Ptr_t *)pAigNew,pTemp0,0,&pTemp1,&pTemp2);
        pAVar2 = pObj;
        pAVar6 = pTemp1;
        if (fCheckZero == 0) {
          if (fCheckOne == 0) {
            pAVar6 = Aig_Not(pTemp1);
            pAVar7 = Aig_Not(pTemp2);
            pAVar6 = Aig_And((Aig_Man_t *)pAVar2,pAVar6,pAVar7);
            pAStack_70 = Aig_Or((Aig_Man_t *)pObj,pAStack_70,pAVar6);
          }
          else {
            pAVar6 = Aig_Not(pTemp1);
            pAVar6 = Aig_And((Aig_Man_t *)pAVar2,pAVar6,pTemp2);
            pAStack_70 = Aig_Or((Aig_Man_t *)pObj,pAStack_70,pAVar6);
          }
        }
        else {
          pAVar7 = Aig_Not(pTemp2);
          pAVar6 = Aig_And((Aig_Man_t *)pAVar2,pAVar6,pAVar7);
          pAStack_70 = Aig_Or((Aig_Man_t *)pObj,pAStack_70,pAVar6);
        }
      }
    }
    pAVar6 = Aig_NotCond(pAStack_70,(int)vCopies);
    Aig_ObjCreateCo((Aig_Man_t *)pObj,pAVar6);
    for (local_74 = 0; iVar5 = Saig_ManRegNum((Aig_Man_t *)vDcFlops_local), pAVar6 = pObj,
        local_74 < iVar5; local_74 = local_74 + 1) {
      pVVar1 = (Vec_Ptr_t *)vDcFlops_local[1].pArray;
      iVar5 = Saig_ManPoNum((Aig_Man_t *)vDcFlops_local);
      pTemp0 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,local_74 + iVar5);
      Saig_ObjDualFanin((Aig_Man_t *)pObj,(Vec_Ptr_t *)pAigNew,pTemp0,0,&pTemp1,&pTemp2);
      pAVar6 = pTemp1;
      if (_fDualFfs_local == (Vec_Int_t *)0x0) {
        pTemp1 = Aig_NotCond(pTemp1,(uint)((fComplPo_local != 0 ^ 0xffU) & 1));
      }
      else {
        iVar5 = Vec_IntEntry(_fDualFfs_local,local_74);
        pTemp1 = Aig_NotCond(pAVar6,(uint)((iVar5 != 0 ^ 0xffU) & 1));
      }
      Aig_ObjCreateCo((Aig_Man_t *)pObj,pTemp1);
      Aig_ObjCreateCo((Aig_Man_t *)pObj,pTemp2);
    }
    iVar5 = Aig_ManRegNum((Aig_Man_t *)vDcFlops_local);
    Aig_ManSetRegNum((Aig_Man_t *)pAVar6,iVar5 << 1);
    Aig_ManCleanup((Aig_Man_t *)pObj);
    Vec_PtrFree((Vec_Ptr_t *)pAigNew);
    return (Aig_Man_t *)pObj;
  }
  __assert_fail("nDualPis >= 0 && nDualPis <= Saig_ManPiNum(pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigDual.c"
                ,0x58,
                "Aig_Man_t *Saig_ManDupDual(Aig_Man_t *, Vec_Int_t *, int, int, int, int, int, int)"
               );
}

Assistant:

Aig_Man_t * Saig_ManDupDual( Aig_Man_t * pAig, Vec_Int_t * vDcFlops, int nDualPis, int fDualFfs, int fMiterFfs, int fComplPo, int fCheckZero, int fCheckOne )
{
    Vec_Ptr_t * vCopies;
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pObj, * pTemp0, * pTemp1, * pTemp2, * pTemp3, * pCare, * pMiter;
    int i;
    assert( Saig_ManPoNum(pAig) > 0 );
    assert( nDualPis >= 0 && nDualPis <= Saig_ManPiNum(pAig) );
    assert( vDcFlops == NULL || Vec_IntSize(vDcFlops) == Aig_ManRegNum(pAig) );
    vCopies = Vec_PtrStart( 2*Aig_ManObjNum(pAig) );
    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    // map the constant node
    Saig_ObjSetDual( vCopies, 0, 0, Aig_ManConst0(pAigNew) );
    Saig_ObjSetDual( vCopies, 0, 1, Aig_ManConst1(pAigNew) );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
    {
        if ( i < nDualPis )
        {
            pTemp0 = Aig_ObjCreateCi( pAigNew );
            pTemp1 = Aig_ObjCreateCi( pAigNew );
        }
        else if ( i < Saig_ManPiNum(pAig) )
        {
            pTemp1 = Aig_ObjCreateCi( pAigNew );
            pTemp0 = Aig_Not( pTemp1 );
        }
        else
        {
            pTemp0 = Aig_ObjCreateCi( pAigNew );
            pTemp1 = Aig_ObjCreateCi( pAigNew );
            if ( vDcFlops )
                pTemp0 = Aig_NotCond( pTemp0, !Vec_IntEntry(vDcFlops, i-Saig_ManPiNum(pAig)) );
            else
                pTemp0 = Aig_NotCond( pTemp0, !fDualFfs );
        }
        Saig_ObjSetDual( vCopies, Aig_ObjId(pObj), 0, Aig_And(pAigNew, pTemp0, Aig_Not(pTemp1)) );
        Saig_ObjSetDual( vCopies, Aig_ObjId(pObj), 1, Aig_And(pAigNew, pTemp1, Aig_Not(pTemp0)) );
    }
    // create internal nodes
    Aig_ManForEachNode( pAig, pObj, i )
    {
        Saig_ObjDualFanin( pAigNew, vCopies, pObj, 0, &pTemp0, &pTemp1 );
        Saig_ObjDualFanin( pAigNew, vCopies, pObj, 1, &pTemp2, &pTemp3 );
        Saig_ObjSetDual( vCopies, Aig_ObjId(pObj), 0, Aig_Or (pAigNew, pTemp0, pTemp2) );
        Saig_ObjSetDual( vCopies, Aig_ObjId(pObj), 1, Aig_And(pAigNew, pTemp1, pTemp3) );
    }
    // create miter and flops
    pMiter = Aig_ManConst0(pAigNew);
    if ( fMiterFfs )
    {
        Saig_ManForEachLi( pAig, pObj, i )
        {
            Saig_ObjDualFanin( pAigNew, vCopies, pObj, 0, &pTemp0, &pTemp1 );
            if ( fCheckZero )
            {
                pCare  = Aig_And( pAigNew, pTemp0, Aig_Not(pTemp1) );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
            else if ( fCheckOne )
            {
                pCare  = Aig_And( pAigNew, Aig_Not(pTemp0), pTemp1 );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
            else // check X
            {
                pCare  = Aig_And( pAigNew, Aig_Not(pTemp0), Aig_Not(pTemp1) );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
        }
    }
    else
    {
        Saig_ManForEachPo( pAig, pObj, i )
        {
            Saig_ObjDualFanin( pAigNew, vCopies, pObj, 0, &pTemp0, &pTemp1 );
            if ( fCheckZero )
            {
                pCare  = Aig_And( pAigNew, pTemp0, Aig_Not(pTemp1) );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
            else if ( fCheckOne )
            {
                pCare  = Aig_And( pAigNew, Aig_Not(pTemp0), pTemp1 );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
            else // check X
            {
                pCare  = Aig_And( pAigNew, Aig_Not(pTemp0), Aig_Not(pTemp1) );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
        }
    }
    // create PO
    pMiter = Aig_NotCond( pMiter, fComplPo );
    Aig_ObjCreateCo( pAigNew, pMiter );
    // create flops
    Saig_ManForEachLi( pAig, pObj, i )
    {
        Saig_ObjDualFanin( pAigNew, vCopies, pObj, 0, &pTemp0, &pTemp1 );
        if ( vDcFlops )
            pTemp0 = Aig_NotCond( pTemp0, !Vec_IntEntry(vDcFlops, i) );
        else
            pTemp0 = Aig_NotCond( pTemp0, !fDualFfs );
        Aig_ObjCreateCo( pAigNew, pTemp0 );
        Aig_ObjCreateCo( pAigNew, pTemp1 );
    }
    // set the flops
    Aig_ManSetRegNum( pAigNew, 2 * Aig_ManRegNum(pAig) );
    Aig_ManCleanup( pAigNew );
    Vec_PtrFree( vCopies );
    return pAigNew;
}